

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationArrow::mouseReleaseEvent(NavigationArrow *this,QMouseEvent *e)

{
  long lVar1;
  char cVar2;
  QMouseEvent QVar3;
  double dVar4;
  double in_XMM1_Qa;
  undefined8 local_30;
  QPoint local_28;
  undefined8 local_20;
  
  if (*(int *)(e + 0x40) == 1) {
    if (((this->d).d)->leftButtonPressed == true) {
      lVar1 = *(long *)&this->field_0x20;
      local_20 = CONCAT44(*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18),
                          *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14));
      local_28.xp = 0;
      local_28.yp = 0;
      dVar4 = (double)QEventPoint::position();
      local_30 = CONCAT44((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000
                                        ) + in_XMM1_Qa),
                          (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) +
                               dVar4));
      cVar2 = QRect::contains(&local_28,SUB81(&local_30,0));
      if (cVar2 != '\0') {
        clicked(this);
      }
    }
    ((this->d).d)->leftButtonPressed = false;
    QVar3 = (QMouseEvent)0x1;
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar3;
  return;
}

Assistant:

void
NavigationArrow::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed && rect().contains( e->pos() ) )
			emit clicked();

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}